

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O2

int rhash_final(rhash ctx,uchar *first_result)

{
  byte *pbVar1;
  uint uVar2;
  code *pcVar3;
  ulong uVar4;
  rhash prVar5;
  uchar buffer [130];
  uchar auStack_a8 [136];
  
  uVar2 = (uint)ctx[1].msg_size;
  if (10 < uVar2) {
    __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0x10b,"int rhash_final(rhash, unsigned char *)");
  }
  if ((~*(uint *)((long)&ctx[1].msg_size + 4) & 3) != 0) {
    if (first_result == (uchar *)0x0) {
      first_result = auStack_a8;
    }
    prVar5 = ctx + 4;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      pcVar3 = (code *)(*(long **)&prVar5[-1].hash_id)[5];
      if (pcVar3 == (code *)0x0) {
        __assert_fail("info->final != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x114,"int rhash_final(rhash, unsigned char *)");
      }
      if (0x81 < *(ulong *)(**(long **)&prVar5[-1].hash_id + 8)) {
        __assert_fail("info->info->digest_size < sizeof(buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x115,"int rhash_final(rhash, unsigned char *)");
      }
      (*pcVar3)(prVar5->msg_size,first_result);
      uVar2 = (uint)ctx[1].msg_size;
      prVar5 = prVar5 + 1;
      first_result = auStack_a8;
    }
    pbVar1 = (byte *)((long)&ctx[1].msg_size + 4);
    *pbVar1 = *pbVar1 | 2;
  }
  return 0;
}

Assistant:

RHASH_API int rhash_final(rhash ctx, unsigned char* first_result)
{
	unsigned i = 0;
	unsigned char buffer[130];
	unsigned char* out = (first_result ? first_result : buffer);
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);

	/* skip final call if already finalized and auto-final is on */
	if ((ectx->flags & RCTX_FINALIZED_MASK) ==
		(RCTX_AUTO_FINAL | RCTX_FINALIZED)) return 0;

	/* call final method for every algorithm */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		assert(info->final != 0);
		assert(info->info->digest_size < sizeof(buffer));
		info->final(ectx->vector[i].context, out);
		out = buffer;
	}
	ectx->flags |= RCTX_FINALIZED;
	return 0; /* no error processing at the moment */
}